

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeAtomicsObject
               (DynamicObject *atomicsObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ulong in_RAX;
  JavascriptString *pJVar1;
  
  DeferredTypeHandlerBase::Convert(typeHandler,atomicsObject,mode,0xc,0);
  this = (((atomicsObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  AddFunctionToLibraryObject
            (this,atomicsObject,0x4a,(FunctionInfo *)AtomicsObject::EntryInfo::Add,3,'\x06');
  AddFunctionToLibraryObject
            (this,atomicsObject,0x47,(FunctionInfo *)AtomicsObject::EntryInfo::And,3,'\x06');
  AddFunctionToLibraryObject
            (this,atomicsObject,0x2cd,(FunctionInfo *)AtomicsObject::EntryInfo::CompareExchange,4,
             '\x06');
  AddFunctionToLibraryObject
            (this,atomicsObject,0x2ce,(FunctionInfo *)AtomicsObject::EntryInfo::Exchange,3,'\x06');
  AddFunctionToLibraryObject
            (this,atomicsObject,0x2cf,(FunctionInfo *)AtomicsObject::EntryInfo::IsLockFree,1,'\x06')
  ;
  AddFunctionToLibraryObject
            (this,atomicsObject,0x45,(FunctionInfo *)AtomicsObject::EntryInfo::Load,2,'\x06');
  AddFunctionToLibraryObject
            (this,atomicsObject,0x48,(FunctionInfo *)AtomicsObject::EntryInfo::Or,3,'\x06');
  AddFunctionToLibraryObject
            (this,atomicsObject,0x46,(FunctionInfo *)AtomicsObject::EntryInfo::Store,3,'\x06');
  AddFunctionToLibraryObject
            (this,atomicsObject,0x15d,(FunctionInfo *)AtomicsObject::EntryInfo::Sub,3,'\x06');
  AddFunctionToLibraryObject
            (this,atomicsObject,0x2d0,(FunctionInfo *)AtomicsObject::EntryInfo::Wait,4,'\x06');
  AddFunctionToLibraryObject
            (this,atomicsObject,0x2d1,(FunctionInfo *)AtomicsObject::EntryInfo::Notify,3,'\x06');
  AddFunctionToLibraryObject
            (this,atomicsObject,0x49,(FunctionInfo *)AtomicsObject::EntryInfo::Xor,3,'\x06');
  if (((((((((atomicsObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->m_ES6ToStringTag ==
      true) {
    pJVar1 = CreateStringFromCppLiteral<8ul>(this,(char16 (*) [8])L"Atomics");
    (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])
              (atomicsObject,0x1b,pJVar1,2,0,0,in_RAX & 0xffffffff00000000);
  }
  DynamicObject::SetHasNoEnumerableProperties(atomicsObject,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAtomicsObject(DynamicObject* atomicsObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(atomicsObject, mode, 12);

        JavascriptLibrary* library = atomicsObject->GetLibrary();

        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::add, &AtomicsObject::EntryInfo::Add, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::and_, &AtomicsObject::EntryInfo::And, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::compareExchange, &AtomicsObject::EntryInfo::CompareExchange, 4);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::exchange, &AtomicsObject::EntryInfo::Exchange, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::isLockFree, &AtomicsObject::EntryInfo::IsLockFree, 1);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::load, &AtomicsObject::EntryInfo::Load, 2);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::or_, &AtomicsObject::EntryInfo::Or, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::store, &AtomicsObject::EntryInfo::Store, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::sub, &AtomicsObject::EntryInfo::Sub, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::wait, &AtomicsObject::EntryInfo::Wait, 4);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::notify, &AtomicsObject::EntryInfo::Notify, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::xor_, &AtomicsObject::EntryInfo::Xor, 3);

        if (atomicsObject->GetScriptContext()->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(atomicsObject, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Atomics")), PropertyConfigurable);
        }

        atomicsObject->SetHasNoEnumerableProperties(true);

        return true;
    }